

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::
     functor_manager_common<boost::_bi::bind_t<void,_void_(*)(boost::unit_test::test_suite_*(*)(int,_char_**)),_boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite_*(*)(int,_char_**)>_>_>_>
     ::manage_small(function_buffer *in_buffer,function_buffer *out_buffer,
                   functor_manager_operation_type op)

{
  bool bVar1;
  type_info_t *ptVar2;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  functor_type *f_1;
  functor_type *f;
  functor_type *in_functor;
  type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *rhs;
  stl_type_index in_stack_ffffffffffffffc0;
  
  if ((in_EDX == 0) || (in_EDX == 1)) {
    *in_RSI = *in_RDI;
    in_RSI[1] = in_RDI[1];
  }
  else if (in_EDX != 2) {
    if (in_EDX == 3) {
      rhs = (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)*in_RSI;
      typeindex::
      type_id<boost::_bi::bind_t<void,void(*)(boost::unit_test::test_suite*(*)(int,char**)),boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite*(*)(int,char**)>>>>
                ();
      bVar1 = typeindex::operator==(in_stack_ffffffffffffffc0.data_,rhs);
      if (bVar1) {
        *in_RSI = in_RDI;
      }
      else {
        *in_RSI = 0;
      }
    }
    else {
      typeindex::
      type_id<boost::_bi::bind_t<void,void(*)(boost::unit_test::test_suite*(*)(int,char**)),boost::_bi::list1<boost::_bi::value<boost::unit_test::test_suite*(*)(int,char**)>>>>
                ();
      ptVar2 = typeindex::stl_type_index::type_info((stl_type_index *)&stack0xffffffffffffffc0);
      *in_RSI = ptVar2;
      *(undefined1 *)(in_RSI + 1) = 0;
      *(undefined1 *)((long)in_RSI + 9) = 0;
    }
  }
  return;
}

Assistant:

static inline void
        manage_small(const function_buffer& in_buffer, function_buffer& out_buffer,
                functor_manager_operation_type op)
        {
          if (op == clone_functor_tag || op == move_functor_tag) {
            const functor_type* in_functor =
              reinterpret_cast<const functor_type*>(in_buffer.data);
            new (reinterpret_cast<void*>(out_buffer.data)) functor_type(*in_functor);

            if (op == move_functor_tag) {
              functor_type* f = reinterpret_cast<functor_type*>(in_buffer.data);
              (void)f; // suppress warning about the value of f not being used (MSVC)
              f->~Functor();
            }
          } else if (op == destroy_functor_tag) {
            // Some compilers (Borland, vc6, ...) are unhappy with ~functor_type.
             functor_type* f = reinterpret_cast<functor_type*>(out_buffer.data);
             (void)f; // suppress warning about the value of f not being used (MSVC)
             f->~Functor();
          } else if (op == check_functor_type_tag) {
             if (*out_buffer.members.type.type == boost::typeindex::type_id<Functor>())
              out_buffer.members.obj_ptr = in_buffer.data;
            else
              out_buffer.members.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.members.type.type = &boost::typeindex::type_id<Functor>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
          }
        }